

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 op_addr_rr_pre(DisasContext_conflict1 *s,arg_ldst_rr *a)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGTemp *a1;
  TCGTemp *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i32 var;
  uintptr_t o;
  TCGv_i32 var_00;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  
  s_00 = s->uc->tcg_ctx;
  iVar1 = a->rn;
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var_00 = (TCGv_i32)((long)a1 - (long)s_00);
  load_reg_var(s,var_00,iVar1);
  if (((s->v8m_stackcheck == true) && (a->rn == 0xd)) && (a->w != 0)) {
    local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    local_40 = (TCGv_i32)((long)s_00 + (long)var_00);
    tcg_gen_callN_aarch64(s_00,helper_v8m_stackcheck_aarch64,(TCGTemp *)0x0,2,&local_48);
  }
  if (a->p != 0) {
    iVar1 = a->rm;
    s_01 = s->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_01);
    load_reg_var(s,var,iVar1);
    gen_arm_shift_im(s_00,var,a->shtype,a->shimm,0);
    if (a->u == 0) {
      tcg_gen_sub_i32(s_00,var_00,var_00,var);
    }
    else {
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                          (TCGArg)((long)s_00 + (long)var));
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
  }
  return var_00;
}

Assistant:

static TCGv_i32 op_addr_rr_pre(DisasContext *s, arg_ldst_rr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr = load_reg(s, a->rn);

    if (s->v8m_stackcheck && a->rn == 13 && a->w) {
        gen_helper_v8m_stackcheck(tcg_ctx, tcg_ctx->cpu_env, addr);
    }

    if (a->p) {
        TCGv_i32 ofs = load_reg(s, a->rm);
        gen_arm_shift_im(tcg_ctx, ofs, a->shtype, a->shimm, 0);
        if (a->u) {
            tcg_gen_add_i32(tcg_ctx, addr, addr, ofs);
        } else {
            tcg_gen_sub_i32(tcg_ctx, addr, addr, ofs);
        }
        tcg_temp_free_i32(tcg_ctx, ofs);
    }
    return addr;
}